

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O0

void printByteCode(Code_attribute codeAttribute,cp_info *constantPool,uint8_t indentation)

{
  u1 uVar1;
  u1 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  FILE *__stream;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  int32_t offset_1;
  int32_t match;
  u4 n_1;
  u4 howManyBytes_1;
  int32_t npairs;
  int32_t defaultbytes_1;
  uint uStack_a8;
  u1 padding_1;
  int32_t offset;
  u4 n;
  int32_t offsets;
  u4 howManyBytes;
  int32_t highbytes;
  int32_t lowbytes;
  int32_t defaultbytes;
  u1 padding;
  int16_t constbyte;
  u2 indexbyte;
  int32_t number_5;
  u2 number_4;
  u2 number_3;
  int16_t number_2;
  u2 number_1;
  int16_t number;
  char *types [8];
  uint local_28;
  uint uStack_24;
  u1 atype;
  u4 i;
  uint32_t lineNumber;
  u1 *code;
  u4 code_length;
  uint8_t indentation_local;
  cp_info *constantPool_local;
  
  uStack_24 = 1;
  local_28 = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        if (codeAttribute.code_length <= local_28) {
                          return;
                        }
                        Utils::printTabs(out,indentation);
                        uVar7 = uStack_24 + 1;
                        fprintf((FILE *)out,"%d\t%d\t%s",(ulong)uStack_24,(ulong)local_28,
                                instructions[codeAttribute.code[local_28]]);
                        __stream = out;
                        if ((((0xf < codeAttribute.code[local_28]) &&
                             ((codeAttribute.code[local_28] < 0x1a ||
                              (0x35 < codeAttribute.code[local_28])))) &&
                            ((codeAttribute.code[local_28] < 0x3b ||
                             (0x83 < codeAttribute.code[local_28])))) &&
                           ((((codeAttribute.code[local_28] < 0x85 ||
                              (0x98 < codeAttribute.code[local_28])) &&
                             ((codeAttribute.code[local_28] < 0xac ||
                              (0xb1 < codeAttribute.code[local_28])))) &&
                            ((((codeAttribute.code[local_28] != 0xbe &&
                               (codeAttribute.code[local_28] != 0xbf)) &&
                              (codeAttribute.code[local_28] != 0xc2)) &&
                             (codeAttribute.code[local_28] != 0xc3)))))) break;
                        fprintf((FILE *)out,"\n");
                        local_28 = local_28 + 1;
                        uStack_24 = uVar7;
                      }
                      if (codeAttribute.code[local_28] != '\x12') break;
                      bVar6 = codeAttribute.code[local_28 + 1];
                      pcVar11 = getFormattedConstant
                                          (constantPool,(ushort)codeAttribute.code[local_28 + 1]);
                      fprintf((FILE *)__stream," #%d <%s>\n",(ulong)bVar6,pcVar11);
                      local_28 = local_28 + 2;
                      uStack_24 = uVar7;
                    }
                    if (codeAttribute.code[local_28] != 0xbc) break;
                    bVar6 = codeAttribute.code[local_28 + 1];
                    memcpy(&number_3,&PTR_anon_var_dwarf_619b_0015ecb0,0x40);
                    fprintf((FILE *)out," %d (%s)\n",(ulong)bVar6,
                            *(undefined8 *)(&number_3 + (long)(int)(bVar6 - 4) * 4));
                    local_28 = local_28 + 2;
                    uStack_24 = uVar7;
                  }
                  if ((((codeAttribute.code[local_28] != '\x10') &&
                       ((codeAttribute.code[local_28] < 0x15 ||
                        (0x19 < codeAttribute.code[local_28])))) &&
                      ((codeAttribute.code[local_28] < 0x36 || (0x3a < codeAttribute.code[local_28])
                       ))) && (codeAttribute.code[local_28] != 0xa9)) break;
                  fprintf((FILE *)out," %d\n",(ulong)codeAttribute.code[local_28 + 1]);
                  local_28 = local_28 + 2;
                  uStack_24 = uVar7;
                }
                if (codeAttribute.code[local_28] != '\x11') break;
                fprintf((FILE *)out," %d\n",
                        (ulong)(uint)(int)CONCAT11(codeAttribute.code[local_28 + 1],
                                                   codeAttribute.code[local_28 + 2]));
                local_28 = local_28 + 3;
                uStack_24 = uVar7;
              }
              if (codeAttribute.code[local_28] != 0x84) break;
              fprintf((FILE *)out," %d by %d\n",(ulong)codeAttribute.code[local_28 + 1],
                      (ulong)codeAttribute.code[local_28 + 2]);
              local_28 = local_28 + 3;
              uStack_24 = uVar7;
            }
            if (((codeAttribute.code[local_28] != '\x13') &&
                (codeAttribute.code[local_28] != '\x14')) &&
               (((codeAttribute.code[local_28] < 0xb2 || (0xb8 < codeAttribute.code[local_28])) &&
                ((((codeAttribute.code[local_28] != 0xbb && (codeAttribute.code[local_28] != 0xbd))
                  && (codeAttribute.code[local_28] != 0xc0)) &&
                 (codeAttribute.code[local_28] != 0xc1)))))) break;
            uVar1 = codeAttribute.code[local_28 + 1];
            uVar2 = codeAttribute.code[local_28 + 2];
            pcVar11 = getFormattedConstant(constantPool,CONCAT11(uVar1,uVar2));
            fprintf((FILE *)__stream," #%d <%s>\n",(ulong)CONCAT11(uVar1,uVar2),pcVar11);
            local_28 = local_28 + 3;
            uStack_24 = uVar7;
          }
          if (((codeAttribute.code[local_28] < 0x99) || (0xa8 < codeAttribute.code[local_28])) &&
             ((codeAttribute.code[local_28] != 0xc6 && (codeAttribute.code[local_28] != 199))))
          break;
          fprintf((FILE *)out," %d (%+d)\n",
                  (ulong)(local_28 +
                         (int)CONCAT11(codeAttribute.code[local_28 + 1],
                                       codeAttribute.code[local_28 + 2])),
                  (ulong)(uint)(int)CONCAT11(codeAttribute.code[local_28 + 1],
                                             codeAttribute.code[local_28 + 2]));
          local_28 = local_28 + 3;
          uStack_24 = uVar7;
        }
        if (codeAttribute.code[local_28] != 0xc5) break;
        uVar1 = codeAttribute.code[local_28 + 1];
        uVar2 = codeAttribute.code[local_28 + 2];
        pcVar11 = getFormattedConstant(constantPool,CONCAT11(uVar1,uVar2));
        fprintf((FILE *)__stream," #%d <%s> dim %d\n",(ulong)CONCAT11(uVar1,uVar2),pcVar11,
                (ulong)codeAttribute.code[local_28 + 3]);
        local_28 = local_28 + 4;
        uStack_24 = uVar7;
      }
      if (codeAttribute.code[local_28] == 0xb9) break;
      if ((codeAttribute.code[local_28] == 200) || (codeAttribute.code[local_28] == 0xc9)) {
        uVar8 = (uint)codeAttribute.code[local_28 + 1] << 0x18 |
                (uint)codeAttribute.code[local_28 + 2] << 0x10 |
                (uint)codeAttribute.code[local_28 + 3] << 8 | (uint)codeAttribute.code[local_28 + 4]
        ;
        fprintf((FILE *)out," %d (%+d)\n",(ulong)(local_28 + uVar8),(ulong)uVar8);
        local_28 = local_28 + 5;
        uStack_24 = uVar7;
      }
      else if (codeAttribute.code[local_28] == 0xc4) {
        uVar1 = codeAttribute.code[local_28 + 2];
        uVar2 = codeAttribute.code[local_28 + 3];
        fprintf((FILE *)out,"\n");
        Utils::printTabs(out,indentation);
        uStack_24 = uStack_24 + 2;
        fprintf((FILE *)out,"%d\t%d\t%s %d",(ulong)uVar7,(ulong)(local_28 + 1),
                instructions[codeAttribute.code[local_28 + 1]],(ulong)CONCAT11(uVar1,uVar2));
        if (codeAttribute.code[local_28 + 1] == 0x84) {
          fprintf((FILE *)out," by %d",
                  (ulong)(uint)(int)CONCAT11(codeAttribute.code[local_28 + 4],
                                             codeAttribute.code[local_28 + 5]));
          local_28 = local_28 + 6;
        }
        else {
          local_28 = local_28 + 4;
        }
        fprintf((FILE *)out,"\n");
      }
      else {
        if (codeAttribute.code[local_28] == 0xaa) {
          bVar6 = (char)local_28 + 1U & 3;
          uVar8 = (uint)codeAttribute.code[bVar6 + local_28 + 1] << 0x18 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 2] << 0x10 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 3] << 8 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 4];
          howManyBytes = (uint)codeAttribute.code[bVar6 + local_28 + 5] << 0x18 |
                         (uint)codeAttribute.code[bVar6 + local_28 + 6] << 0x10 |
                         (uint)codeAttribute.code[bVar6 + local_28 + 7] << 8 |
                         (uint)codeAttribute.code[bVar6 + local_28 + 8];
          uVar9 = (uint)codeAttribute.code[bVar6 + local_28 + 9] << 0x18 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 10] << 0x10 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 0xb] << 8 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 0xc];
          fprintf((FILE *)out," %d to %d\n",(ulong)howManyBytes,(ulong)uVar9);
          n = bVar6 + 0xd;
          iVar10 = uVar9 - howManyBytes;
          uStack_24 = uVar7;
          for (uStack_a8 = 0; uStack_a8 < iVar10 + 1U; uStack_a8 = uStack_a8 + 1) {
            uVar7 = (uint)codeAttribute.code[local_28 + n] << 0x18 |
                    (uint)codeAttribute.code[local_28 + n + 1] << 0x10 |
                    (uint)codeAttribute.code[local_28 + n + 2] << 8 |
                    (uint)codeAttribute.code[local_28 + n + 3];
            Utils::printTabs(out,indentation);
            uVar12 = (ulong)uStack_24;
            uStack_24 = uStack_24 + 1;
            fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",uVar12,(ulong)howManyBytes,
                    (ulong)(local_28 + uVar7),(ulong)uVar7);
            howManyBytes = howManyBytes + 1;
            n = n + 4;
          }
          Utils::printTabs(out,indentation);
          fprintf((FILE *)out,"%d\t\t\tdefault: %d (%+d)\n",(ulong)uStack_24,
                  (ulong)(local_28 + uVar8),(ulong)uVar8);
        }
        else {
          if (codeAttribute.code[local_28] != 0xab) {
            fprintf((FILE *)out,"Invalid instruction opcode.\n");
            exit(7);
          }
          bVar6 = (char)local_28 + 1U & 3;
          uVar8 = (uint)codeAttribute.code[bVar6 + local_28 + 1] << 0x18 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 2] << 0x10 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 3] << 8 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 4];
          uVar9 = (uint)codeAttribute.code[bVar6 + local_28 + 5] << 0x18 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 6] << 0x10 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 7] << 8 |
                  (uint)codeAttribute.code[bVar6 + local_28 + 8];
          match = bVar6 + 9;
          fprintf((FILE *)out," %d\n",(ulong)uVar9);
          uStack_24 = uVar7;
          for (offset_1 = 0; (uint)offset_1 < uVar9; offset_1 = offset_1 + 1) {
            bVar6 = codeAttribute.code[local_28 + match];
            bVar3 = codeAttribute.code[local_28 + match + 1];
            bVar4 = codeAttribute.code[local_28 + match + 2];
            bVar5 = codeAttribute.code[local_28 + match + 3];
            uVar7 = (uint)codeAttribute.code[local_28 + match + 4] << 0x18 |
                    (uint)codeAttribute.code[local_28 + match + 5] << 0x10 |
                    (uint)codeAttribute.code[local_28 + match + 6] << 8 |
                    (uint)codeAttribute.code[local_28 + match + 7];
            Utils::printTabs(out,indentation);
            uVar12 = (ulong)uStack_24;
            uStack_24 = uStack_24 + 1;
            fprintf((FILE *)out,"%d\t\t\t%d: %d (%+d)\n",uVar12,
                    (ulong)((uint)bVar6 << 0x18 | (uint)bVar3 << 0x10 | (uint)bVar4 << 8 |
                           (uint)bVar5),(ulong)(local_28 + uVar7),(ulong)uVar7);
            match = match + 8;
          }
          Utils::printTabs(out,indentation);
          fprintf((FILE *)out,"%d\t\t\tdefault: %d (%+d)\n",(ulong)uStack_24,
                  (ulong)(local_28 + uVar8),(ulong)uVar8);
          n = match;
        }
        uStack_24 = uStack_24 + 1;
        local_28 = n + local_28;
      }
    }
    uVar1 = codeAttribute.code[local_28 + 1];
    uVar2 = codeAttribute.code[local_28 + 2];
    pcVar11 = getFormattedConstant(constantPool,CONCAT11(uVar1,uVar2));
    fprintf((FILE *)__stream," #%d <%s> count %d\n",(ulong)CONCAT11(uVar1,uVar2),pcVar11,
            (ulong)codeAttribute.code[local_28 + 3]);
    if (codeAttribute.code[local_28 + 4] != '\0') break;
    local_28 = local_28 + 5;
    uStack_24 = uVar7;
  }
  __assert_fail("code[i+4] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/classviewer.cpp"
                ,0x1ea,"void printByteCode(Code_attribute, cp_info *, uint8_t)");
}

Assistant:

void printByteCode(Code_attribute codeAttribute, cp_info *constantPool, uint8_t indentation) {
    u4 code_length = codeAttribute.code_length;
    u1 *code = codeAttribute.code;
    
    uint32_t lineNumber = 1;
    u4 i = 0;
    while (i < code_length) {
        Utils::printTabs(out, indentation);
        fprintf(out,"%d\t%d\t%s", lineNumber++, i, instructions[code[i]]);
        
        if (code[i] <= 0x0f || (code[i] >= 0x1a && code[i] <= 0x35) || (code[i] >= 0x3b && code[i] <= 0x83) || (code[i] >= 0x85 && code[i] <= 0x98) ||
            (code[i] >= 0xac && code[i] <= 0xb1) || code[i] == 0xbe || code[i] == 0xbf || code[i] == 0xc2 || code[i] == 0xc3) {
            fprintf(out,"\n");
            i += 1;
        } else if (code[i] == 0x12) { // usa CP
            fprintf(out," #%d <%s>\n", code[i+1], getFormattedConstant(constantPool, code[i+1]));
            i += 2;
        } else if (code[i] == 0xbc) { // newarray
            u1 atype = code[i+1];
            const char* types[] = {"boolean", "char", "float", "double", "byte", "short", "int", "long"};
            fprintf(out," %d (%s)\n", atype, types[atype-4]);
            i += 2;
        } else if (code[i] == 0x10 || (code[i] >= 0x15 && code[i] <= 0x19) || (code[i] >= 0x36 && code[i] <= 0x3a) || code[i] == 0xa9) {
            fprintf(out," %d\n", code[i+1]);
            i += 2;
        } else if (code[i] == 0x11) { // sipush
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d\n", number);
            i += 3;
        } else if (code[i] == 0x84) { // iinc
            fprintf(out," %d by %d\n", code[i+1], code[i+2]);
            i += 3;
        } else if (code[i] == 0x13 || code[i] == 0x14 || (code[i] >= 0xb2 && code[i] <= 0xb8) ||
                   code[i] == 0xbb || code[i] == 0xbd || code[i] == 0xc0 || code[i] == 0xc1) { // usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s>\n", number, getFormattedConstant(constantPool, number));
            i += 3;
        } else if ((code[i] >= 0x99 && code[i] <= 0xa8) || code[i] == 0xc6 || code[i] == 0xc7) {
            int16_t number = (code[i+1] << 8) | code[i+2];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 3;
        } else if (code[i] == 0xc5) { // multianewarray - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> dim %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            i += 4;
        } else if (code[i] == 0xb9) { // invokeinterface - usa CP
            u2 number = (code[i+1] << 8) | code[i+2];
            fprintf(out," #%d <%s> count %d\n", number, getFormattedConstant(constantPool, number), code[i+3]);
            assert(code[i+4] == 0);
            i += 5;
        } else if (code[i] == 0xc8 || code[i] == 0xc9) { // goto_w e jsr_w
            int32_t number = (code[i+1] << 24) | (code[i+2] << 16) | (code[i+3] << 8) | code[i+4];
            fprintf(out," %d (%+d)\n", i+number, number);
            i += 5;
        } else if (code[i] == 0xc4) { // wide
            u2 indexbyte = (code[i+2] << 8) | code[i+3];
            
            fprintf(out,"\n");
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t%d\t%s %d", lineNumber++, i+1, instructions[code[i+1]], indexbyte);
            
            if (code[i+1] == 0x84) { // format 2 (iinc)
                int16_t constbyte = (code[i+4] << 8) | code[i+5];
                fprintf(out," by %d", constbyte);
                i += 6;
            } else {
                i += 4;
            }
            
            fprintf(out,"\n");
        } else if (code[i] == 0xaa) { // tableswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t lowbytes = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            int32_t highbytes = (code[padding+i+9] << 24) | (code[padding+i+10] << 16) | (code[padding+i+11] << 8) | code[padding+i+12];
            
            fprintf(out," %d to %d\n", lowbytes, highbytes);
            
            u4 howManyBytes = 1 + padding + 12; // 1 (instruction) + padding + 12 (the 12 bytes above)
            int32_t offsets = highbytes - lowbytes + 1;
            
            for (u4 n = 0; n < offsets; n++) {
                int32_t offset = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, lowbytes, i + offset, offset);
                
                lowbytes++;
                howManyBytes += 4;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else if (code[i] == 0xab) { // lookupswitch
            u1 padding = (i+1) % 4;
            int32_t defaultbytes = (code[padding+i+1] << 24) | (code[padding+i+2] << 16) | (code[padding+i+3] << 8) | code[padding+i+4];
            int32_t npairs = (code[padding+i+5] << 24) | (code[padding+i+6] << 16) | (code[padding+i+7] << 8) | code[padding+i+8];
            
            u4 howManyBytes = 1 + padding + 8; // 1 (instruction) + padding + 8 (the 8 bytes above)
            
            fprintf(out," %d\n", npairs);
            
            for (u4 n = 0; n < npairs; n++) {
                int32_t match = (code[i+howManyBytes] << 24) | (code[i+howManyBytes+1] << 16) | (code[i+howManyBytes+2] << 8) | code[i+howManyBytes+3];
                int32_t offset = (code[i+howManyBytes+4] << 24) | (code[i+howManyBytes+5] << 16) | (code[i+howManyBytes+6] << 8) | code[i+howManyBytes+7];
                Utils::printTabs(out, indentation);
                fprintf(out,"%d\t\t\t%d: %d (%+d)\n", lineNumber++, match, i + offset, offset);
                howManyBytes += 8;
            }
            Utils::printTabs(out, indentation);
            fprintf(out,"%d\t\t\tdefault: %d (%+d)\n", lineNumber++, i + defaultbytes, defaultbytes);
            
            i += howManyBytes;
        } else {
            fprintf(out,"Invalid instruction opcode.\n");
            exit(7);
        }
    }
}